

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * anon_unknown.dwarf_dd40c::generateNamespacedType
                   (string *__return_storage_ptr__,string *type)

{
  bool bVar1;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          starts_with(type,"Vk");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Vk",&local_59);
    stripPrefix(&local_58,type,&local_38);
    std::operator+(__return_storage_ptr__,"VULKAN_HPP_NAMESPACE::",&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,type);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string generateNamespacedType( std::string const & type )
  {
    return type.starts_with( "Vk" ) ? ( "VULKAN_HPP_NAMESPACE::" + stripPrefix( type, "Vk" ) ) : type;
  }